

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O2

enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
toml::find_or<toml::type_config,char[6]>
          (basic_value<toml::type_config> *v,char (*k) [6],basic_value<toml::type_config> *opt)

{
  value_type *pvVar1;
  key_type local_30;
  
  detail::key_cast<toml::type_config>(&local_30,*k);
  pvVar1 = basic_value<toml::type_config>::at(v,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pvVar1;
}

Assistant:

cxx::enable_if_t<detail::is_type_config<TC>::value, basic_value<TC>>&
find_or(basic_value<TC>& v, const K& k, basic_value<TC>& opt) noexcept
{
    try
    {
        return ::toml::find(v, detail::key_cast<TC>(k));
    }
    catch(...)
    {
        return opt;
    }
}